

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp sexp_make_opcode(sexp ctx,sexp self,sexp name,sexp op_class,sexp code,sexp num_args,sexp flags,
                     sexp arg1t,sexp arg2t,sexp invp,sexp data,sexp data2,sexp_proc1 func)

{
  sexp psVar1;
  char *msg;
  
  psVar1 = num_args;
  if ((((ulong)num_args & 1) == 0) || (psVar1 = flags, ((ulong)flags & 1) == 0)) {
    psVar1 = sexp_type_exception(ctx,self,2,psVar1);
    return psVar1;
  }
  if ((((ulong)op_class & 1) == 0) || (((long)op_class >> 1) - 0xcU < 0xfffffffffffffff5)) {
    msg = "make-opcode: bad opcode class";
  }
  else {
    if ((((ulong)code & 1) != 0) && (0xffffffffffffffac < ((long)code >> 1) - 0x54U)) {
      psVar1 = sexp_alloc_tagged_aux(ctx,0x70,0x1b);
      (psVar1->value).flonum_bits[0x58] = (char)((long)op_class >> 1);
      (psVar1->value).flonum_bits[0x59] = (char)((long)code >> 1);
      (psVar1->value).flonum_bits[0x5a] = (char)((ulong)num_args >> 1);
      (psVar1->value).flonum_bits[0x5b] = (char)((ulong)flags >> 1);
      (psVar1->value).type.id = arg1t;
      (psVar1->value).type.print = arg2t;
      (psVar1->value).flonum_bits[0x5c] = (char)((ulong)invp >> 1);
      (psVar1->value).type.cpl = data;
      (psVar1->value).type.slots = data2;
      (psVar1->value).opcode.func = func;
      (psVar1->value).type.name = name;
      (psVar1->value).opcode.dl = (sexp)(ctx->value).opcode.func;
      return psVar1;
    }
    msg = "make-opcode: bad opcode";
    op_class = code;
  }
  psVar1 = sexp_xtype_exception(ctx,self,msg,op_class);
  return psVar1;
}

Assistant:

sexp sexp_make_opcode (sexp ctx, sexp self, sexp name, sexp op_class, sexp code,
                       sexp num_args, sexp flags, sexp arg1t, sexp arg2t,
                       sexp invp, sexp data, sexp data2, sexp_proc1 func) {
  sexp res;
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, num_args);
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, flags);
  if ((! sexp_fixnump(op_class)) || (sexp_unbox_fixnum(op_class) <= 0)
      || (sexp_unbox_fixnum(op_class) >= SEXP_OPC_NUM_OP_CLASSES))
    res = sexp_xtype_exception(ctx, self, "make-opcode: bad opcode class", op_class);
  else if ((! sexp_fixnump(code)) || (sexp_unbox_fixnum(code) <= 0)
      || (sexp_unbox_fixnum(code) >= SEXP_OP_NUM_OPCODES))
    res = sexp_xtype_exception(ctx, self, "make-opcode: bad opcode", code);
  else {
    res = sexp_alloc_type(ctx, opcode, SEXP_OPCODE);
    sexp_opcode_class(res) = (unsigned char)sexp_unbox_fixnum(op_class);
    sexp_opcode_code(res) = (unsigned char)sexp_unbox_fixnum(code);
    sexp_opcode_num_args(res) = (unsigned char)sexp_unbox_fixnum(num_args);
    sexp_opcode_flags(res) = (unsigned char)sexp_unbox_fixnum(flags);
    sexp_opcode_arg1_type(res) = arg1t;
    sexp_opcode_arg2_type(res) = arg2t;
    sexp_opcode_inverse(res) = (unsigned char)sexp_unbox_fixnum(invp);
    sexp_opcode_data(res) = data;
    sexp_opcode_data2(res) = data2;
    sexp_opcode_func(res) = func;
    sexp_opcode_name(res) = name;
#if SEXP_USE_DL
    sexp_opcode_dl(res) = sexp_context_dl(ctx);
#endif
  }
  return res;
}